

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

int pbrt::Log2Int(float v)

{
  int iVar1;
  
  if (v < 1.0) {
    iVar1 = Log2Int(1.0 / v);
    return -iVar1;
  }
  return (((uint)v >> 0x17) - (uint)(((uint)v & 0x7fffff) < 0x3504f3)) + -0x7e;
}

Assistant:

PBRT_CPU_GPU
inline int Log2Int(float v) {
    DCHECK_GT(v, 0);
    if (v < 1)
        return -Log2Int(1 / v);
    // https://graphics.stanford.edu/~seander/bithacks.html#IntegerLog
    // (With an additional check of the significant to get round-to-nearest
    // rather than round down.)
    // midsignif = Significand(std::pow(2., 1.5))
    // i.e. grab the significand of a value halfway between two exponents,
    // in log space.
    const uint32_t midsignif = 0b00000000001101010000010011110011;
    return Exponent(v) + ((Significand(v) >= midsignif) ? 1 : 0);
}